

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlogging.cpp
# Opt level: O2

void qt_message(QtMsgType msgType,QMessageLogContext *context,char *msg,__va_list_tag *ap)

{
  bool bVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QString::vasprintf((char **)&local_38,msg,ap);
  qt_message_print(msgType,context,(QString *)&local_38);
  bVar1 = isFatal(msgType);
  if (bVar1) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      qAbort();
    }
  }
  else {
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE
static void qt_message(QtMsgType msgType, const QMessageLogContext &context, const char *msg, va_list ap)
{
    QString buf = QString::vasprintf(msg, ap);
    qt_message_print(msgType, context, buf);
    qt_maybe_message_fatal(msgType, context, buf);
}